

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  bool bVar1;
  uint uVar2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *this_00;
  reference ppIVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar4;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  bool local_e1;
  IReporter **curr_rep;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  String local_a0;
  String local_88;
  String local_70;
  String local_58;
  byte local_29;
  String local_28;
  ResultBuilder *local_10;
  ResultBuilder *this_local;
  
  local_10 = this;
  if (((this->super_AssertData).m_at & is_throws) == 0) {
    if ((((this->super_AssertData).m_at & is_throws_as) == 0) ||
       (((this->super_AssertData).m_at & is_throws_with) == 0)) {
      if (((this->super_AssertData).m_at & is_throws_as) == 0) {
        if (((this->super_AssertData).m_at & is_throws_with) == 0) {
          if (((this->super_AssertData).m_at & is_nothrow) != 0) {
            (this->super_AssertData).m_failed = (bool)((this->super_AssertData).m_threw & 1);
          }
        }
        else {
          String::String(&local_58,(this->super_AssertData).m_exception_string);
          bVar1 = operator!=(&(this->super_AssertData).m_exception,&local_58);
          (this->super_AssertData).m_failed = bVar1;
          String::~String(&local_58);
        }
      }
      else {
        (this->super_AssertData).m_failed =
             (bool)(((this->super_AssertData).m_threw_as ^ 0xffU) & 1);
      }
    }
    else {
      local_29 = 0;
      local_e1 = true;
      if (((this->super_AssertData).m_threw_as & 1U) != 0) {
        String::String(&local_28,(this->super_AssertData).m_exception_string);
        local_29 = 1;
        local_e1 = operator!=(&(this->super_AssertData).m_exception,&local_28);
      }
      (this->super_AssertData).m_failed = local_e1;
      if ((local_29 & 1) != 0) {
        String::~String(&local_28);
      }
    }
  }
  else {
    (this->super_AssertData).m_failed = (bool)(((this->super_AssertData).m_threw ^ 0xffU) & 1);
  }
  uVar2 = String::size(&(this->super_AssertData).m_exception);
  dVar4 = extraout_XMM0_Qa;
  if (uVar2 != 0) {
    String::String(&local_a0,"\"");
    operator+(&local_88,&local_a0,&(this->super_AssertData).m_exception);
    String::String((String *)&__range3,"\"");
    operator+(&local_70,&local_88,(String *)&__range3);
    String::operator=(&(this->super_AssertData).m_exception,&local_70);
    String::~String(&local_70);
    String::~String((String *)&__range3);
    String::~String(&local_88);
    String::~String(&local_a0);
    dVar4 = extraout_XMM0_Qa_00;
  }
  if ((is_running_in_test & 1) == 0) {
    if (((this->super_AssertData).m_failed & 1U) != 0) {
      failed_out_of_a_testing_context(&this->super_AssertData);
      dVar4 = extraout_XMM0_Qa_03;
    }
  }
  else {
    anon_unknown_14::addAssert((this->super_AssertData).m_at);
    this_00 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)(g_cs + 0x10d0)
    ;
    __end3 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                       (this_00);
    curr_rep = (IReporter **)
               std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                         (this_00);
    while (bVar1 = __gnu_cxx::
                   operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             (&__end3,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                       *)&curr_rep), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator*(&__end3);
      (*(*ppIVar3)->_vptr_IReporter[9])(*ppIVar3,this);
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&__end3);
    }
    dVar4 = extraout_XMM0_Qa_01;
    if (((this->super_AssertData).m_failed & 1U) != 0) {
      anon_unknown_14::addFailedAssert((this->super_AssertData).m_at);
      dVar4 = extraout_XMM0_Qa_02;
    }
  }
  if ((((this->super_AssertData).m_failed & 1U) != 0) &&
     (bVar1 = isDebuggerActive(), dVar4 = extraout_XMM0_Qa_04, bVar1)) {
    getContextOptions();
    dVar4 = extraout_XMM0_Qa_05;
  }
  return dVar4;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }